

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

void __thiscall cmExportCommand::cmExportCommand(cmExportCommand *this)

{
  cmCommandArgumentsHelper *args;
  cmCommandArgumentGroup *group;
  
  args = &(this->super_cmCommand).Helper;
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmCommand).Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Enabled = true;
  (this->super_cmCommand).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmExportCommand_005b3a40;
  group = &this->ArgumentGroup;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ArgumentGroup).ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCAStringVector::cmCAStringVector(&this->Targets,args,"TARGETS",(cmCommandArgumentGroup *)0x0);
  cmCAEnabler::cmCAEnabler(&this->Append,args,"APPEND",group);
  cmCAString::cmCAString(&this->ExportSetName,args,"EXPORT",group);
  cmCAString::cmCAString(&this->Namespace,args,"NAMESPACE",group);
  cmCAString::cmCAString(&this->Filename,args,"FILE",group);
  cmCAEnabler::cmCAEnabler(&this->ExportOld,args,"EXPORT_LINK_INTERFACE_LIBRARIES",group);
  (this->ErrorMessage)._M_dataplus._M_p = (pointer)&(this->ErrorMessage).field_2;
  (this->ErrorMessage)._M_string_length = 0;
  (this->ErrorMessage).field_2._M_local_buf[0] = '\0';
  this->ExportSet = (cmExportSet *)0x0;
  return;
}

Assistant:

cmExportCommand::cmExportCommand()
:cmCommand()
,ArgumentGroup()
,Targets(&Helper, "TARGETS")
,Append(&Helper, "APPEND", &ArgumentGroup)
,ExportSetName(&Helper, "EXPORT", &ArgumentGroup)
,Namespace(&Helper, "NAMESPACE", &ArgumentGroup)
,Filename(&Helper, "FILE", &ArgumentGroup)
,ExportOld(&Helper, "EXPORT_LINK_INTERFACE_LIBRARIES", &ArgumentGroup)
{
  this->ExportSet = 0;
}